

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_102731::modifyType(bool modify_version)

{
  ulong uVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  char *__filename;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  IoExc *this;
  byte in_DIL;
  int i_3;
  char x_2;
  fpos_t position_1;
  char y;
  char x_1;
  char x;
  fpos_t position;
  size_t nr;
  string attrib_name;
  int length;
  char a;
  size_t i_2;
  int i_1;
  fpos_t verflag_pos;
  int i;
  FILE *f;
  int in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  int local_a8;
  undefined1 local_a1;
  fpos_t local_a0;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  fpos_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  int local_70;
  string local_60 [32];
  __uint32_t local_40;
  char local_39;
  ulong local_38;
  int local_2c;
  fpos_t local_28;
  int local_14;
  FILE *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  __filename = (char *)std::__cxx11::string::c_str();
  local_10 = fopen(__filename,"r+b");
  std::operator<<((ostream *)&std::cout," simulating new part type ");
  std::ostream::flush();
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    fgetc(local_10);
  }
  fgetpos(local_10,&local_28);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    fgetc(local_10);
  }
  local_38 = 0;
  do {
    uVar1 = local_38;
    sVar5 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                      ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                       (anonymous_namespace)::headers);
    if (sVar5 <= uVar1) {
      return;
    }
    do {
      local_40 = 0;
      std::__cxx11::string::string(local_60);
      do {
        iVar4 = fgetc(local_10);
        local_39 = (char)iVar4;
        if (local_39 != '\0') {
          std::__cxx11::string::operator+=(local_60,local_39);
        }
        local_40 = local_40 + 1;
      } while (local_39 != '\0');
      if (local_40 == 1) {
        local_70 = 0xc;
      }
      else {
        do {
          iVar4 = fgetc(local_10);
          local_39 = (char)iVar4;
        } while (local_39 != '\0');
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                fread(&local_40,4,1,local_10);
        local_78 = __lhs;
        if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
          this = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::IoExc::IoExc(this,"unable to read length of attribute");
          __cxa_throw(this,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
        }
        if ((Imf_3_4::GLOBAL_SYSTEM_LITTLE_ENDIAN & 1) == 0) {
          local_40 = __bswap_32(local_40);
        }
        if (((local_1 & 1) == 0) &&
           (bVar2 = std::operator==(in_stack_ffffffffffffff20,
                                    (char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                     in_stack_ffffffffffffff18)), bVar2)) {
          fgetpos(local_10,&local_88);
          fsetpos(local_10,&local_88);
          local_89 = 0x58;
          fwrite(&local_89,1,1,local_10);
          sVar5 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                             (anonymous_namespace)::headers);
          if (sVar5 == 1) {
            std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                      ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                       (anonymous_namespace)::headers,0);
            Imf_3_4::Header::type_abi_cxx11_();
            _Var3 = std::operator==(__lhs,in_stack_ffffffffffffff38);
            if (!_Var3) {
              std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                        ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                         (anonymous_namespace)::headers,0);
              in_stack_ffffffffffffff20 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Imf_3_4::Header::type_abi_cxx11_();
              _Var3 = std::operator==(__lhs,in_stack_ffffffffffffff38);
              if (!_Var3) goto LAB_0019b79c;
            }
            std::operator<<((ostream *)&std::cerr," flipping header ");
            fsetpos(local_10,&local_28);
            local_8a = 2;
            local_8b = 8;
            fwrite(&local_8a,1,1,local_10);
            fwrite(&local_8b,1,1,local_10);
          }
LAB_0019b79c:
          fclose(local_10);
          std::operator<<((ostream *)&std::cerr," modified ");
          local_70 = 1;
        }
        else {
          if ((local_1 & 1) != 0) {
            bVar2 = std::operator==(in_stack_ffffffffffffff20,
                                    (char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                     in_stack_ffffffffffffff18));
            in_stack_ffffffffffffff1c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff1c);
            if (bVar2) {
              fgetpos(local_10,&local_a0);
              fsetpos(local_10,&local_a0);
              local_a1 = 0x58;
              fwrite(&local_a1,1,1,local_10);
              fclose(local_10);
              std::operator<<((ostream *)&std::cerr," modified ");
              local_70 = 1;
              goto LAB_0019b8b1;
            }
          }
          for (local_a8 = 0; local_a8 < (int)local_40; local_a8 = local_a8 + 1) {
            fgetc(local_10);
          }
          local_70 = 0;
        }
      }
LAB_0019b8b1:
      std::__cxx11::string::~string(local_60);
      in_stack_ffffffffffffff18 = local_70;
    } while (local_70 == 0);
    if (local_70 == 1) {
      return;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void
modifyType (bool modify_version)
{
    FILE* f = fopen (filename.c_str (), "r+b");

    cout << " simulating new part type ";
    cout.flush ();

    for (int i = 0; i < 4; i++)
    {
        fgetc (f); // magic number
    }
    fpos_t verflag_pos;
    fgetpos (f, &verflag_pos);
    for (int i = 0; i < 4; i++)
    {
        fgetc (f); // version
    }

    // skip over each header
    for (size_t i = 0; i < headers.size (); i++)
    {
        // read each attribute in header i
        while (1)
        {
            char a;
            int  length = 0;

            std::string attrib_name;
            //name
            do
            {
                a = fgetc (f);
                if (a != '\0') attrib_name += a;
                length++;
            } while (a != '\0');

            // check for end-of-header byte
            if (length == 1) break;

            //type of attribute
            do
            {
                a = fgetc (f);

            } while (a != '\0');

            //length of attribute
            size_t nr = fread (&length, 4, 1, f);
            if (nr != 1)
                throw IEX_NAMESPACE::IoExc (
                    "unable to read length of attribute");
            if (!GLOBAL_SYSTEM_LITTLE_ENDIAN) { length = bswap_32 (length); }

            if (!modify_version && attrib_name == "type")
            {
                // modify the type of part 1 to be 'X<whatevever>'
                fpos_t position;
                fgetpos (f, &position);
                fsetpos (f, &position);
                char x = 'X';
                fwrite (&x, 1, 1, f);

                // need to set the 'not just an image' byte for single part regular image files
                // and clear the tiled bit
                if (headers.size () == 1 &&
                    (headers[0].type () == SCANLINEIMAGE ||
                     headers[0].type () == TILEDIMAGE))
                {
                    cerr << " flipping header ";

                    fsetpos (f, &verflag_pos);
                    char x = 2;
                    char y = 8;
                    fwrite (&x, 1, 1, f);
                    fwrite (&y, 1, 1, f);
                }
                fclose (f);

                cerr << " modified ";
                return;
            }

            if (modify_version && attrib_name == "version")
            {
                fpos_t position;
                fgetpos (f, &position);
                fsetpos (f, &position);
                char x = 'X';
                fwrite (&x, 1, 1, f);
                fclose (f);
                cerr << " modified ";
                return;
            }

            //value of attribute
            for (int i = 0; i < length; i++)
            {
                fgetc (f);
            }
        }
    }
}